

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rangecontrols.cpp
# Opt level: O2

void __thiscall QAccessibleSpinBox::QAccessibleSpinBox(QAccessibleSpinBox *this,QWidget *w)

{
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QAccessibleAbstractSpinBox::QAccessibleAbstractSpinBox(&this->super_QAccessibleAbstractSpinBox,w);
  *(undefined ***)&(this->super_QAccessibleAbstractSpinBox).super_QAccessibleWidget =
       &PTR__QAccessibleAbstractSpinBox_007e32f8;
  *(undefined ***)
   &(this->super_QAccessibleAbstractSpinBox).super_QAccessibleWidget.
    super_QAccessibleActionInterface = &PTR__QAccessibleSpinBox_007e3488;
  *(undefined ***)&(this->super_QAccessibleAbstractSpinBox).super_QAccessibleValueInterface =
       &PTR__QAccessibleSpinBox_007e34d0;
  *(undefined ***)&(this->super_QAccessibleAbstractSpinBox).super_QAccessibleTextInterface =
       &PTR__QAccessibleSpinBox_007e3518;
  *(undefined ***)&(this->super_QAccessibleAbstractSpinBox).super_QAccessibleEditableTextInterface =
       &PTR__QAccessibleSpinBox_007e35b8;
  latin1.m_data = "valueChanged(int)";
  latin1.m_size = 0x11;
  QString::QString((QString *)&local_30,latin1);
  QAccessibleWidget::addControllingSignal((QAccessibleWidget *)this,(QString *)&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleSpinBox::QAccessibleSpinBox(QWidget *w)
: QAccessibleAbstractSpinBox(w)
{
    Q_ASSERT(spinBox());
    addControllingSignal("valueChanged(int)"_L1);
}